

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

bool __thiscall soul::AST::EndpointDetails::isResolved(EndpointDetails *this)

{
  size_t sVar1;
  pool_ref<soul::AST::Expression> *ppVar2;
  long *plVar3;
  char cVar4;
  bool bVar5;
  long lVar6;
  pool_ptr<soul::AST::Expression> local_28;
  
  sVar1 = (this->dataTypes).numActive;
  if (sVar1 != 0) {
    ppVar2 = (this->dataTypes).items;
    lVar6 = 0;
    do {
      plVar3 = *(long **)((long)&ppVar2->object + lVar6);
      if (((int)plVar3[5] != 1) || (cVar4 = (**(code **)(*plVar3 + 0x18))(), cVar4 == '\0')) {
        return false;
      }
      lVar6 = lVar6 + 8;
    } while (sVar1 << 3 != lVar6);
  }
  local_28.object = (this->arraySize).object;
  if (local_28.object == (Expression *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = isResolvedAsConstant(&local_28);
  }
  return bVar5;
}

Assistant:

bool isResolved() const
        {
            for (auto& t : dataTypes)
                if (! isResolvedAsType (t.get()))
                    return false;

            return arraySize == nullptr || isResolvedAsConstant (arraySize);
        }